

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.h
# Opt level: O2

int __thiscall vec<WatchElem>::remove(vec<WatchElem> *this,char *__filename)

{
  WatchElem *pWVar1;
  anon_union_8_2_743a5d44_for_WatchElem_0 aVar2;
  Clause *pCVar3;
  
  aVar2._a._4_4_ = 0;
  aVar2._a._0_4_ = this->sz;
  pWVar1 = this->data;
  pCVar3 = (Clause *)0x0;
  do {
    if (aVar2._pt == pCVar3) {
LAB_0019c179:
      return (int)aVar2._a;
    }
    if (pWVar1[(long)pCVar3].field_0._pt == (Clause *)*(uint64_t *)__filename) {
      aVar2 = (anon_union_8_2_743a5d44_for_WatchElem_0)pWVar1[this->sz - 1].field_0._a;
      pWVar1[(long)pCVar3].field_0._a = (uint64_t)aVar2;
      this->sz = this->sz - 1;
      goto LAB_0019c179;
    }
    pCVar3 = (Clause *)&pCVar3->field_0x1;
  } while( true );
}

Assistant:

void remove(const T& t) {
		unsigned int j;
		for (j = 0; j < sz && data[j] != t; j++) {
			;
		}
		if (j < sz) {
			data[j] = last();
			pop();
		}
	}